

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void http_parse_query(http_s *h)

{
  size_t sVar1;
  FIOBJ FVar2;
  fiobj_object_vtable_s *pfVar3;
  char *pcVar4;
  void *pvVar5;
  uint uVar6;
  char cVar7;
  char *pcVar8;
  char *pcVar9;
  fio_str_info_s q;
  fio_str_info_s local_38;
  
  FVar2 = h->query;
  if (FVar2 == 0) {
    return;
  }
  if (h->params == 0) {
    FVar2 = fiobj_hash_new();
    h->params = FVar2;
    FVar2 = h->query;
    if (FVar2 != 0) goto LAB_0014ac5c;
LAB_0014ace9:
    local_38.data = anon_var_dwarf_20c;
    uVar6 = 4;
    goto LAB_0014acfc;
  }
LAB_0014ac5c:
  cVar7 = (char)FVar2;
  if ((FVar2 & 1) != 0) {
    fio_ltocstr(&local_38,(long)FVar2 >> 1);
    goto LAB_0014ad0a;
  }
  pfVar3 = &FIOBJECT_VTABLE_STRING;
  switch((uint)FVar2 & 6) {
  case 0:
    cVar7 = *(char *)(FVar2 & 0xfffffffffffffff8);
LAB_0014ac87:
    switch(cVar7) {
    case '\'':
      pfVar3 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      break;
    case ')':
      pfVar3 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_0014ac7c_caseD_4;
    case '+':
      pfVar3 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar3 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 4:
switchD_0014ac7c_caseD_4:
    pfVar3 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar7 == '&') {
      local_38.data = anon_var_dwarf_217;
      uVar6 = 5;
    }
    else {
      uVar6 = (uint)FVar2 & 0xff;
      if (uVar6 != 0x16) {
        if (uVar6 == 6) goto LAB_0014ace9;
        goto LAB_0014ac87;
      }
      local_38.data = anon_var_dwarf_222;
      uVar6 = 4;
    }
LAB_0014acfc:
    local_38.capa._0_4_ = 0;
    local_38.capa._4_4_ = 0;
    local_38.len = (size_t)uVar6;
    goto LAB_0014ad0a;
  }
  (*pfVar3->to_str)(&local_38,FVar2);
LAB_0014ad0a:
  do {
    pcVar9 = local_38.data;
    sVar1 = local_38.len;
    pcVar4 = (char *)memchr(local_38.data,0x26,local_38.len);
    pcVar8 = pcVar9 + sVar1;
    if (pcVar4 != (char *)0x0) {
      pcVar8 = pcVar4;
    }
    pvVar5 = memchr(pcVar9,0x3d,(long)pcVar8 - (long)pcVar9);
    if (pvVar5 != (void *)0x0) {
      http_add2hash(h->params,pcVar9,(long)pvVar5 - (long)pcVar9,(char *)((long)pvVar5 + 1),
                    (long)pcVar8 - ((long)pvVar5 + 1),'\x01');
    }
    pcVar9 = pcVar8;
    if ((((*pcVar8 == '&') && (pcVar9 = pcVar8 + 1, pcVar8[1] == 'a')) && (pcVar8[2] == 'm')) &&
       ((pcVar8[3] == 'p' && (pcVar8[4] == ';')))) {
      pcVar9 = pcVar8 + 5;
    }
    local_38.len = (size_t)(local_38.data + (local_38.len - (long)pcVar9));
    local_38.data = pcVar9;
  } while ((char *)local_38.len != (char *)0x0);
  return;
}

Assistant:

void http_parse_query(http_s *h) {
  if (!h->query)
    return;
  if (!h->params)
    h->params = fiobj_hash_new();
  fio_str_info_s q = fiobj_obj2cstr(h->query);
  do {
    char *cut = memchr(q.data, '&', q.len);
    if (!cut)
      cut = q.data + q.len;
    char *cut2 = memchr(q.data, '=', (cut - q.data));
    if (cut2) {
      /* we only add named elements... */
      http_add2hash(h->params, q.data, (size_t)(cut2 - q.data), (cut2 + 1),
                    (size_t)(cut - (cut2 + 1)), 1);
    }
    if (cut[0] == '&') {
      /* protecting against some ...less informed... clients */
      if (cut[1] == 'a' && cut[2] == 'm' && cut[3] == 'p' && cut[4] == ';')
        cut += 5;
      else
        cut += 1;
    }
    q.len -= (uintptr_t)(cut - q.data);
    q.data = cut;
  } while (q.len);
}